

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadhb.c
# Opt level: O3

void dreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  double dVar2;
  int *addr;
  int_t *__s;
  int_t *addr_00;
  long lVar3;
  ulong uVar4;
  int_t *piVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int_t *piVar11;
  void *addr_01;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_21c;
  int_t *local_218;
  double **local_210;
  int_t **local_208;
  void *local_200;
  int_t *local_1f8;
  double *local_1f0;
  int_t *local_1e8;
  int_t *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  undefined1 local_1bc;
  byte local_1bb;
  undefined1 local_1b9;
  long local_1b8;
  FILE *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_218 = nonz;
  local_210 = nzval;
  local_208 = rowind;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar12 = 5;
  iVar13 = 0;
  iVar8 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_21c);
    if (iVar12 == 2) {
      iVar8 = local_21c;
    }
    iVar14 = local_21c;
    if (local_21c == 0) {
      iVar14 = iVar13;
    }
    if (iVar12 != 1) {
      iVar14 = iVar13;
    }
    iVar13 = iVar14;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1bc);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1b9 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *nrow = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *ncol = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  piVar5 = local_218;
  *local_218 = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_21c = atoi(local_1a8);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  dallocateA(*ncol,*piVar5,local_210,local_208,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  dParseIntFormat(local_1a8,&local_1c0,&local_1c4);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  dParseIntFormat(local_1a8,&local_1c8,&local_1cc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  dParseFloatFormat(local_1a8,&local_1d0,&local_1d4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  if (iVar13 != 0) {
    do {
      iVar12 = fgetc((FILE *)fp);
    } while (iVar12 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1c0,local_1c4);
  ReadVector(fp,*piVar5,*local_208,local_1c8,local_1cc);
  if (iVar8 != 0) {
    dReadValues(fp,*piVar5,*local_210,local_1d0,local_1d4);
  }
  if ((local_1bb & 0xdf) == 0x53) {
    uVar15 = *ncol;
    uVar7 = (ulong)uVar15;
    piVar5 = *local_208;
    addr = *colptr;
    pdVar6 = *local_210;
    iVar8 = uVar15 + 1;
    __s = intMalloc(iVar8);
    if (__s == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    addr_00 = intMalloc(iVar8);
    if (addr_00 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    piVar11 = local_218;
    local_1f8 = intMalloc(*local_218);
    local_1e8 = piVar5;
    if (local_1f8 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xcf,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      piVar5 = local_1e8;
      superlu_abort_and_exit(local_138);
    }
    local_200 = superlu_malloc((long)*piVar11 << 3);
    local_1f0 = pdVar6;
    if (local_200 == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xd1,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      pdVar6 = local_1f0;
      superlu_abort_and_exit(local_138);
    }
    if ((int)uVar15 < 1) {
      *addr_00 = 0;
    }
    else {
      uVar9 = 0;
      memset(__s,0,uVar7 * 4);
      iVar12 = *addr;
      do {
        lVar3 = uVar9 + 1;
        uVar9 = uVar9 + 1;
        iVar13 = addr[lVar3];
        if (iVar12 < addr[lVar3]) {
          lVar3 = (long)iVar12;
          do {
            __s[piVar5[lVar3]] = __s[piVar5[lVar3]] + 1;
            lVar3 = lVar3 + 1;
            iVar13 = addr[uVar9];
          } while (lVar3 < addr[uVar9]);
        }
        iVar12 = iVar13;
      } while (uVar9 != uVar7);
      *addr_00 = 0;
      uVar9 = 0;
      do {
        addr_00[uVar9 + 1] = __s[uVar9] + addr_00[uVar9];
        __s[uVar9] = addr_00[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      iVar12 = *addr;
      uVar9 = 0;
      do {
        uVar4 = uVar9 + 1;
        iVar13 = addr[uVar9 + 1];
        if (iVar12 < addr[uVar9 + 1]) {
          lVar3 = (long)iVar12;
          do {
            iVar12 = piVar5[lVar3];
            local_1f8[__s[iVar12]] = (int_t)uVar9;
            iVar13 = __s[iVar12];
            *(double *)((long)local_200 + (long)iVar13 * 8) = pdVar6[lVar3];
            __s[iVar12] = iVar13 + 1;
            lVar3 = lVar3 + 1;
            iVar13 = addr[uVar4];
          } while (lVar3 < addr[uVar4]);
        }
        iVar12 = iVar13;
        uVar9 = uVar4;
      } while (uVar4 != uVar7);
    }
    lVar3 = (long)*local_218 * 2 - (long)(int)uVar15;
    local_1e0 = intMalloc(iVar8);
    if (local_1e0 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1b0 = (FILE *)fp;
    piVar5 = intMalloc((int_t)lVar3);
    if (piVar5 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xec,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1b8 = lVar3;
    pdVar6 = (double *)superlu_malloc(lVar3 * 8);
    if (pdVar6 == (double *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xee,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadhb.c");
      superlu_abort_and_exit(local_138);
    }
    *local_1e0 = 0;
    piVar11 = local_1f8;
    addr_01 = local_200;
    if (0 < (int)uVar15) {
      uVar15 = 0;
      uVar9 = 0;
      do {
        lVar3 = (long)addr_00[uVar9];
        uVar4 = uVar9 + 1;
        iVar8 = addr_00[uVar9 + 1];
        if (addr_00[uVar9] < iVar8) {
          do {
            if (uVar9 != (uint)piVar11[lVar3]) {
              piVar5[(int)uVar15] = piVar11[lVar3];
              dVar2 = *(double *)((long)addr_01 + lVar3 * 8);
              pdVar6[(int)uVar15] = dVar2;
              if (ABS(dVar2) < 4.047e-300) {
                printf("%5d: %e\n",(ulong)uVar15);
                piVar11 = local_1f8;
                addr_01 = local_200;
              }
              uVar15 = uVar15 + 1;
              iVar8 = addr_00[uVar4];
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar8);
        }
        lVar3 = (long)addr[uVar9];
        if (addr[uVar9] < addr[uVar4]) {
          lVar10 = 0;
          do {
            piVar5[(int)uVar15 + lVar10] = local_1e8[lVar3 + lVar10];
            pdVar6[(int)uVar15 + lVar10] = local_1f0[lVar3 + lVar10];
            lVar1 = lVar3 + lVar10;
            lVar10 = lVar10 + 1;
          } while (lVar1 + 1 < (long)addr[uVar4]);
          uVar15 = uVar15 + (int)lVar10;
          piVar11 = local_1f8;
          addr_01 = local_200;
        }
        local_1e0[uVar4] = uVar15;
        uVar9 = uVar4;
      } while (uVar4 != uVar7);
    }
    lVar3 = local_1b8;
    printf("FormFullA: new_nnz = %lld\n",local_1b8);
    superlu_free(local_1f0);
    superlu_free(local_1e8);
    superlu_free(addr);
    superlu_free(__s);
    superlu_free(addr_01);
    superlu_free(piVar11);
    superlu_free(addr_00);
    *local_210 = pdVar6;
    *local_208 = piVar5;
    *colptr = local_1e0;
    *local_218 = (int_t)lVar3;
    fp = (FILE *)local_1b0;
  }
  fclose((FILE *)fp);
  return;
}

Assistant:

void
dreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	double **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    dDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    dDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    dallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    dParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    dDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) dDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        dReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}